

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
Catch::Benchmark::Detail::estimate_clock_resolution<std::chrono::_V2::steady_clock>
          (EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,int iterations)

{
  double dVar1;
  ClockDuration<std::chrono::_V2::steady_clock> how_long;
  pointer first;
  pointer last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_00;
  _func_vector<double,_std::allocator<double>_>_int **in_R8;
  vector<double,_std::allocator<double>_> r;
  _Vector_base<double,_std::allocator<double>_> local_60;
  code *local_48;
  TimingOf<std::chrono::_V2::steady_clock,_std::vector<double>_(*)(int),_run_for_at_least_argument_t<steady_clock,_vector<double,_allocator<double>_>_(*)(int)>_>
  local_40;
  
  how_long.__r._4_4_ = 0;
  how_long.__r._0_4_ = iterations;
  last_00._M_current = (double *)&local_48;
  local_48 = resolution<std::chrono::_V2::steady_clock>;
  run_for_at_least<std::chrono::_V2::steady_clock,std::vector<double,std::allocator<double>>(*)(int)>
            (&local_40,(Detail *)0x1dcd6500,how_long,(int)last_00._M_current,in_R8);
  last = local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  first = local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
  local_60._M_impl.super__Vector_impl_data._M_start =
       local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_60._M_impl.super__Vector_impl_data._M_finish =
       local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_40.result.super__Vector_base<double,_std::allocator<double>_>);
  dVar1 = mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     first,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )last);
  (__return_storage_ptr__->mean).__r = dVar1;
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&__return_storage_ptr__->outliers,(Detail *)first,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)last,
             last_00);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  return __return_storage_ptr__;
}

Assistant:

EnvironmentEstimate<FloatDuration<Clock>> estimate_clock_resolution(int iterations) {
                auto r = run_for_at_least<Clock>(std::chrono::duration_cast<ClockDuration<Clock>>(clock_resolution_estimation_time), iterations, &resolution<Clock>)
                    .result;
                return {
                    FloatDuration<Clock>(mean(r.begin(), r.end())),
                    classify_outliers(r.begin(), r.end()),
                };
            }